

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetAttributes
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,PropertyAttributes attributes)

{
  byte bVar1;
  ScriptContext *this_00;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  DictionaryPropertyDescriptor<unsigned_short> *this_01;
  bool bVar4;
  PropertyId propertyId_00;
  uint32 index;
  BOOL BVar5;
  undefined4 *puVar6;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  int i;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x7d3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  local_48 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord,
                     (int *)&descriptor);
  if (bVar4) {
    bVar1 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1);
    BVar5 = 0;
    if ((bVar1 & 8) == 0) {
      *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject + 1) = attributes & 7 | bVar1 & 0xf0;
      if ((attributes & 1) != 0) {
        DynamicObject::SetHasNoEnumerableProperties(instance,false);
      }
      pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      Memory::Recycler::WBSetBit((char *)&descriptor);
      descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                   &pJVar2->typesWithOnlyWritablePropertyProtoChain;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
      this_01 = descriptor;
      if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 0x400) == 0) {
        DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
        if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
          propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(this_00,propertyId);
          ScriptContext::InvalidateStoreFieldCaches(this_00,propertyId_00);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                    ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)this_01);
        }
      }
      BVar5 = 1;
    }
  }
  else {
    bVar4 = DynamicObject::HasObjectArray(instance);
    BVar5 = 0;
    if ((bVar4) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar5 = DynamicObject::SetObjectArrayItemAttributes(instance,index,attributes);
    }
  }
  return BVar5;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            descriptor->Attributes = (descriptor->Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);

            if (descriptor->Attributes & PropertyEnumerable)
            {
                instance->SetHasNoEnumerableProperties(false);
            }

            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);

            return true;
        }

        // Check numeric propertyId only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::SetItemAttributes(instance, propertyRecord->GetNumericValue(), attributes);
        }

        return false;
    }